

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_tree_renderer.cpp
# Opt level: O3

void __thiscall
duckdb::JSONTreeRenderer::ToStreamInternal(JSONTreeRenderer *this,RenderTree *root,ostream *ss)

{
  yyjson_val_pool *pool;
  ulong uVar1;
  bool bVar2;
  yyjson_mut_doc *doc;
  yyjson_mut_val *pyVar3;
  char *__s;
  size_t sVar4;
  InternalException *this_00;
  yyjson_mut_val *pyVar5;
  yyjson_mut_doc *doc_00;
  yyjson_mut_val *val;
  string local_50;
  
  doc = duckdb_yyjson::yyjson_mut_doc_new((yyjson_alc *)0x0);
  if (doc == (yyjson_mut_doc *)0x0) {
    doc_00 = (yyjson_mut_doc *)0x0;
  }
  else {
    pool = &doc->val_pool;
    val = (doc->val_pool).cur;
    if ((doc->val_pool).end == val) {
      bVar2 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pool,&doc->alc,1);
      if (bVar2) {
        val = pool->cur;
        goto LAB_001de481;
      }
    }
    else {
LAB_001de481:
      pool->cur = val + 1;
      if (val != (yyjson_mut_val *)0x0) {
        val->tag = 6;
        doc->root = val;
        pyVar3 = RenderRecursive(doc,root,0,0);
        if ((pyVar3 != (yyjson_mut_val *)0x0) && (uVar1 = val->tag, ((uint)uVar1 & 7) == 6)) {
          val->tag = (uVar1 & 0xfffffffffffffffe) + 0x100;
          pyVar5 = pyVar3;
          if (0xff < uVar1) {
            pyVar5 = *(yyjson_mut_val **)((val->uni).u64 + 0x10);
            *(yyjson_mut_val **)((val->uni).u64 + 0x10) = pyVar3;
          }
          pyVar3->next = pyVar5;
          (val->uni).str = (char *)pyVar3;
        }
        goto LAB_001de4eb;
      }
    }
    doc->root = (yyjson_mut_val *)0x0;
    doc_00 = doc;
  }
  val = (yyjson_mut_val *)0x0;
  RenderRecursive(doc_00,root,0,0);
LAB_001de4eb:
  __s = duckdb_yyjson::yyjson_mut_val_write_opts
                  (val,9,(yyjson_alc *)0x0,(usize *)0x0,(yyjson_write_err *)0x0);
  if (__s != (char *)0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    sVar4 = strlen(__s);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,__s + sVar4);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (ss,local_50._M_dataplus._M_p,local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    free(__s);
    duckdb_yyjson::yyjson_mut_doc_free(doc);
    return;
  }
  duckdb_yyjson::yyjson_mut_doc_free(doc);
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"The plan could not be rendered as JSON, yyjson failed","");
  InternalException::InternalException(this_00,&local_50);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void JSONTreeRenderer::ToStreamInternal(RenderTree &root, std::ostream &ss) {
	auto doc = yyjson_mut_doc_new(nullptr);
	auto result_obj = yyjson_mut_arr(doc);
	yyjson_mut_doc_set_root(doc, result_obj);

	auto plan = RenderRecursive(doc, root, 0, 0);
	yyjson_mut_arr_append(result_obj, plan);

	auto data = yyjson_mut_val_write_opts(result_obj, YYJSON_WRITE_ALLOW_INF_AND_NAN | YYJSON_WRITE_PRETTY, nullptr,
	                                      nullptr, nullptr);
	if (!data) {
		yyjson_mut_doc_free(doc);
		throw InternalException("The plan could not be rendered as JSON, yyjson failed");
	}
	ss << string(data);
	free(data);
	yyjson_mut_doc_free(doc);
}